

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O1

UChar * __thiscall
icu_63::UCharsTrie::Iterator::branchNext
          (Iterator *this,UChar *pos,int32_t length,UErrorCode *errorCode)

{
  short sVar1;
  UChar UVar2;
  UChar UVar3;
  int iVar4;
  UVector32 *pUVar5;
  char16_t *pcVar6;
  bool bVar7;
  UBool UVar8;
  uint uVar9;
  UChar *pUVar10;
  UChar *pUVar11;
  ulong uVar12;
  uint uVar13;
  UChar local_3a;
  UChar *local_38;
  
  uVar13 = length;
  if (5 < length) {
    do {
      pUVar10 = pos + 2;
      pUVar11 = pUVar10;
      if (0xfbff < (ushort)pos[1]) {
        if (pos[1] == L'\xffff') {
          pUVar11 = pos + 4;
        }
        else {
          pUVar11 = pos + 3;
        }
      }
      pUVar5 = this->stack_;
      pcVar6 = this->uchars_;
      iVar4 = pUVar5->count;
      if (((-2 < iVar4) && (iVar4 < pUVar5->capacity)) ||
         (UVar8 = UVector32::expandCapacity(pUVar5,iVar4 + 1,errorCode), UVar8 != '\0')) {
        pUVar5->elements[pUVar5->count] = (int32_t)((ulong)((long)pUVar11 - (long)pcVar6) >> 1);
        pUVar5->count = pUVar5->count + 1;
      }
      pUVar5 = this->stack_;
      sVar1 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar9 = (this->str_).fUnion.fFields.fLength;
      }
      else {
        uVar9 = (int)sVar1 >> 5;
      }
      length = uVar13 >> 1;
      iVar4 = pUVar5->count;
      if (((-2 < iVar4) && (iVar4 < pUVar5->capacity)) ||
         (UVar8 = UVector32::expandCapacity(pUVar5,iVar4 + 1,errorCode), UVar8 != '\0')) {
        pUVar5->elements[pUVar5->count] = uVar9 | (uVar13 - length) * 0x10000;
        pUVar5->count = pUVar5->count + 1;
      }
      UVar2 = pos[1];
      uVar9 = (uint)(ushort)UVar2;
      if (0xfbff < (ushort)UVar2) {
        if (UVar2 == L'\xffff') {
          uVar9 = CONCAT22(pos[2],pos[3]);
          pUVar10 = pos + 4;
        }
        else {
          pUVar10 = pos + 3;
          uVar9 = (uint)(ushort)UVar2 * 0x10000 + (uint)(ushort)pos[2] + 0x4000000;
        }
      }
      pos = pUVar10 + (int)uVar9;
      bVar7 = 0xb < uVar13;
      uVar13 = length;
    } while (bVar7);
  }
  local_38 = pos + 2;
  UVar2 = pos[1];
  uVar9 = (ushort)UVar2 & 0x7fff;
  uVar13 = uVar9;
  if (0x3fff < uVar9) {
    if (uVar9 == 0x7fff) {
      uVar13 = (uint)(ushort)pos[2] << 0x10;
      pUVar10 = pos + 3;
    }
    else {
      uVar13 = uVar9 * 0x10000 + 0xc0000000;
      pUVar10 = local_38;
    }
    uVar13 = (ushort)*pUVar10 | uVar13;
  }
  if (0x3fff < uVar9) {
    if (uVar9 == 0x7fff) {
      local_38 = pos + 4;
    }
    else {
      local_38 = pos + 3;
    }
  }
  UVar3 = *pos;
  pUVar5 = this->stack_;
  uVar12 = (long)local_38 - (long)this->uchars_;
  iVar4 = pUVar5->count;
  if (((-2 < iVar4) && (iVar4 < pUVar5->capacity)) ||
     (UVar8 = UVector32::expandCapacity(pUVar5,iVar4 + 1,errorCode), UVar8 != '\0')) {
    pUVar5->elements[pUVar5->count] = (int32_t)(uVar12 >> 1);
    pUVar5->count = pUVar5->count + 1;
  }
  pUVar5 = this->stack_;
  sVar1 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar9 = (this->str_).fUnion.fFields.fLength;
  }
  else {
    uVar9 = (int)sVar1 >> 5;
  }
  iVar4 = pUVar5->count;
  if (((-2 < iVar4) && (iVar4 < pUVar5->capacity)) ||
     (UVar8 = UVector32::expandCapacity(pUVar5,iVar4 + 1,errorCode), UVar8 != '\0')) {
    pUVar5->elements[pUVar5->count] = uVar9 | length * 0x10000 - 0x10000U;
    pUVar5->count = pUVar5->count + 1;
  }
  local_3a = UVar3;
  UnicodeString::doAppend(&this->str_,&local_3a,0,1);
  if (UVar2 < L'\0') {
    this->pos_ = (char16_t *)0x0;
    this->value_ = uVar13;
    local_38 = (UChar *)0x0;
  }
  else {
    local_38 = local_38 + (int)uVar13;
  }
  return local_38;
}

Assistant:

const UChar *
UCharsTrie::Iterator::branchNext(const UChar *pos, int32_t length, UErrorCode &errorCode) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        // Push state for the greater-or-equal edge.
        stack_->addElement((int32_t)(skipDelta(pos)-uchars_), errorCode);
        stack_->addElement(((length-(length>>1))<<16)|str_.length(), errorCode);
        // Follow the less-than edge.
        length>>=1;
        pos=jumpByDelta(pos);
    }
    // List of key-value pairs where values are either final values or jump deltas.
    // Read the first (key, value) pair.
    UChar trieUnit=*pos++;
    int32_t node=*pos++;
    UBool isFinal=(UBool)(node>>15);
    int32_t value=readValue(pos, node&=0x7fff);
    pos=skipValue(pos, node);
    stack_->addElement((int32_t)(pos-uchars_), errorCode);
    stack_->addElement(((length-1)<<16)|str_.length(), errorCode);
    str_.append(trieUnit);
    if(isFinal) {
        pos_=NULL;
        value_=value;
        return NULL;
    } else {
        return pos+value;
    }
}